

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<Minisat::Option*,Minisat::Option::OptionLt>(undefined8 *array,ulong param_2)

{
  undefined8 *puVar1;
  Option *y;
  undefined8 uVar2;
  bool bVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  OptionLt local_c2;
  OptionLt local_c1;
  ulong local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  ulong local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  ulong local_90;
  undefined8 *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar7 = (uint)param_2;
  uVar16 = param_2 & 0xffffffff;
  if (0xf < (int)uVar7) {
    if (uVar7 < 0x21) {
      y = (Option *)array[param_2 >> 1 & 0x7fffffff];
      uVar14 = 0xffffffffffffffff;
      while( true ) {
        uVar14 = (ulong)(int)uVar14;
        puVar4 = array + uVar14;
        do {
          uVar14 = uVar14 + 1;
          puVar1 = puVar4 + 1;
          puVar4 = puVar4 + 1;
          bVar3 = Option::OptionLt::operator()(&local_c2,(Option *)*puVar1,y);
        } while (bVar3);
        uVar16 = (ulong)(int)uVar16;
        do {
          lVar18 = uVar16 - 1;
          uVar16 = uVar16 - 1;
          bVar3 = Option::OptionLt::operator()(&local_c2,y,(Option *)array[lVar18]);
        } while (bVar3);
        if ((long)uVar16 <= (long)uVar14) break;
        uVar2 = *puVar4;
        *puVar4 = array[uVar16];
        array[uVar16] = uVar2;
      }
      sort<Minisat::Option*,Minisat::Option::OptionLt>(array,uVar14 & 0xffffffff);
      sort<Minisat::Option*,Minisat::Option::OptionLt>(puVar4,uVar7 - (int)uVar14);
    }
    else {
      local_80 = param_2 & 0xffffffff;
      local_70 = local_80 * 8;
      puVar4 = (undefined8 *)operator_new__(local_70);
      uVar14 = 0;
      uVar16 = 1;
      do {
        local_a8 = uVar16 & 0xffffffff;
        iVar15 = (int)uVar16;
        uVar11 = iVar15 * 2;
        local_90 = (ulong)uVar11;
        local_48 = (long)(int)uVar11;
        local_68 = (ulong)(iVar15 - 1);
        local_50 = (long)iVar15;
        local_58 = local_80 - local_50;
        local_60 = local_48 * 8;
        uVar8 = 0;
        local_c0 = uVar14;
        local_b8 = array;
        local_b0 = puVar4;
        local_88 = puVar4;
        do {
          local_38 = (long)(int)uVar11;
          if ((long)local_80 < (long)(int)uVar11) {
            local_38 = local_80;
          }
          uVar9 = (uint)uVar8;
          uVar5 = (int)local_90 + uVar9;
          local_40 = (ulong)uVar5;
          if ((int)uVar7 < (int)uVar5) {
            local_40 = param_2 & 0xffffffff;
          }
          uVar16 = uVar8 + local_50;
          uVar5 = (uint)uVar16;
          uVar13 = (int)local_50 + uVar5;
          if ((int)uVar7 <= (int)uVar13) {
            uVar13 = uVar7;
          }
          local_78 = uVar8;
          if (((int)local_50 < 1) || ((long)(int)uVar13 <= (long)uVar16)) {
            lVar18 = (long)(int)uVar9;
          }
          else {
            uVar14 = uVar16 & 0xffffffff;
            uVar10 = uVar8 & 0xffffffff;
            uVar8 = uVar8 & 0xffffffff;
            puVar4 = local_b0;
            local_a0 = uVar13;
            local_9c = uVar11;
            do {
              uVar11 = (uint)uVar10;
              lVar17 = (long)(int)uVar11;
              uVar5 = (uint)uVar14;
              lVar12 = (long)(int)uVar5;
              local_98 = uVar11;
              local_94 = uVar5;
              bVar3 = Option::OptionLt::operator()
                                (&local_c1,(Option *)array[lVar17],(Option *)array[lVar12]);
              if (bVar3) {
                lVar18 = (long)(int)(uVar11 + 1);
                lVar12 = lVar17;
                uVar5 = local_94;
                uVar9 = uVar11 + 1;
              }
              else {
                uVar5 = uVar5 + 1;
                lVar18 = lVar17;
                uVar9 = local_98;
              }
              uVar10 = (ulong)uVar9;
              uVar14 = (ulong)uVar5;
              *puVar4 = array[lVar12];
              uVar8 = (ulong)((int)uVar8 + 1);
              uVar11 = local_9c;
              uVar13 = local_a0;
            } while ((lVar18 < (long)uVar16) && (puVar4 = puVar4 + 1, (int)uVar5 < (int)local_a0));
          }
          puVar1 = local_88;
          uVar6 = (uint)uVar8;
          if (lVar18 < (long)uVar16) {
            memcpy(local_88 + (int)uVar6,array + lVar18,
                   (ulong)(((int)local_68 + (int)local_78) - uVar9) * 8 + 8);
            uVar6 = (uVar6 + (int)local_a8) - (int)lVar18;
          }
          array = local_b8;
          if ((int)uVar5 < (int)uVar13) {
            memcpy(puVar1 + (int)uVar6,local_b8 + (int)uVar5,(ulong)((int)local_40 + ~uVar5) * 8 + 8
                  );
            uVar6 = (uVar6 + (int)local_38) - uVar5;
          }
          uVar16 = local_90;
          uVar8 = local_78 + local_48;
          iVar15 = (int)local_90;
          local_a8 = (ulong)(uint)((int)local_a8 + iVar15);
          uVar11 = uVar11 + iVar15;
          local_b0 = (undefined8 *)((long)local_b0 + local_60);
        } while ((long)uVar8 < local_58);
        puVar4 = array;
        if ((int)uVar6 < (int)uVar7) {
          memcpy(puVar1 + (int)uVar6,array + (int)uVar6,(ulong)(~uVar6 + uVar7) * 8 + 8);
          puVar4 = local_b8;
        }
        uVar14 = (ulong)((int)local_c0 + 1);
        array = puVar1;
      } while (iVar15 < (int)uVar7);
      if ((local_c0 & 1) == 0) {
        memcpy(puVar4,puVar1,local_70);
        puVar4 = puVar1;
      }
      if (puVar4 != (undefined8 *)0x0) {
        operator_delete__(puVar4);
      }
    }
    return;
  }
  selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(array,param_2 & 0xffffffff);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}